

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

VoidPromiseAndPipeline * __thiscall
capnp::anon_unknown_0::MembraneHook::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,MembraneHook *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  bool bVar2;
  ClientHook *pCVar3;
  MembranePolicy *pMVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  PromiseNode *pPVar7;
  long *plVar8;
  MembraneHook *pMVar9;
  long *plVar10;
  PipelineHook *pPVar11;
  byte bVar12;
  uint64_t uVar13;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar14;
  NullableValue<kj::Promise<void>_> r;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> p;
  Maybe<capnp::Capability::Client> redirect;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_e8;
  undefined1 local_d0 [16];
  PromiseNode *pPStack_c0;
  _func_int **local_b8;
  Promise<kj::Own<capnp::ClientHook>_> local_b0;
  PromiseNode *pPStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  long *plStack_90;
  uint64_t local_88;
  VoidPromiseAndPipeline *local_80;
  char local_78 [8];
  undefined8 *local_70;
  long *local_68;
  Refcounted *local_60;
  MembraneHook *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  long *plStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  long *plStack_38;
  
  if ((this->resolved).ptr.ptr == (ClientHook *)0x0) {
    bVar2 = this->reverse;
    pMVar4 = (this->policy).ptr;
    local_88 = interfaceId;
    local_80 = __return_storage_ptr__;
    if (bVar2 == true) {
      (*((this->inner).ptr)->_vptr_ClientHook[4])(&local_98);
      local_40 = local_98;
      uStack_3c = uStack_94;
      plStack_38 = plStack_90;
      plStack_90 = (long *)0x0;
      (*pMVar4->_vptr_MembranePolicy[1])(local_78,pMVar4,local_88,methodId);
    }
    else {
      (*((this->inner).ptr)->_vptr_ClientHook[4])(&local_98);
      local_50 = local_98;
      uStack_4c = uStack_94;
      plStack_48 = plStack_90;
      plStack_90 = (long *)0x0;
      (**pMVar4->_vptr_MembranePolicy)(local_78,pMVar4,local_88,methodId);
    }
    plVar10 = plStack_38;
    plVar8 = plStack_48;
    if (bVar2 == false) {
      if (plStack_48 != (long *)0x0) {
        plStack_48 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_4c,local_50))
                  ((undefined8 *)CONCAT44(uStack_4c,local_50),
                   (long)plVar8 + *(long *)(*plVar8 + -0x10));
      }
      plVar8 = plStack_90;
      uVar13 = local_88;
      if (plStack_90 != (long *)0x0) {
        plStack_90 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_94,local_98))
                  ((undefined8 *)CONCAT44(uStack_94,local_98),
                   (long)plVar8 + *(long *)(*plVar8 + -0x10));
        uVar13 = local_88;
      }
    }
    else {
      if (plStack_38 != (long *)0x0) {
        plStack_38 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_3c,local_40))
                  ((undefined8 *)CONCAT44(uStack_3c,local_40),
                   (long)plVar10 + *(long *)(*plVar10 + -0x10));
      }
      uVar13 = local_88;
      plVar8 = plStack_90;
      if ((bVar2 != false) && (plStack_90 != (long *)0x0)) {
        plStack_90 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_94,local_98))
                  ((undefined8 *)CONCAT44(uStack_94,local_98),
                   (long)plVar8 + *(long *)(*plVar8 + -0x10));
      }
    }
    if (local_78[0] == '\x01') {
      whenMoreResolved(&local_e8,this);
      __return_storage_ptr__ = local_80;
      bVar2 = local_e8.ptr.isSet;
      local_d0[0] = local_e8.ptr.isSet;
      if ((capnp)local_e8.ptr.isSet == (capnp)0x1) {
        local_d0._8_8_ = local_e8.ptr.field_1.value.super_PromiseBase.node.disposer;
        pPStack_c0 = local_e8.ptr.field_1.value.super_PromiseBase.node.ptr;
        local_e8.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        puVar1 = &(this->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        local_60 = &this->super_Refcounted;
        local_58 = this;
        kj::Promise<kj::Own<capnp::ClientHook>>::attach<kj::Own<capnp::ClientHook>>
                  ((Promise<kj::Own<capnp::ClientHook>> *)&local_b0,
                   (Own<capnp::ClientHook> *)(local_d0 + 8));
        newLocalPromiseClient((capnp *)&local_e8,&local_b0);
        (*(local_e8.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer[1])
                  (__return_storage_ptr__,local_e8.ptr.field_1.value.super_PromiseBase.node.disposer
                   ,local_88,methodId,context);
        uVar6 = local_e8.ptr.field_1.value.super_PromiseBase.node.disposer;
        if (local_e8.ptr.field_1.value.super_PromiseBase.node.disposer != (Disposer *)0x0) {
          local_e8.ptr.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
          (**(code **)*(_func_int **)local_e8.ptr._0_8_)
                    (local_e8.ptr._0_8_,
                     ((Disposer *)uVar6)->_vptr_Disposer[-2] +
                     (long)&((Disposer *)uVar6)->_vptr_Disposer);
        }
        pPVar7 = local_b0.super_PromiseBase.node.ptr;
        if ((Disposer *)local_b0.super_PromiseBase.node.ptr != (Disposer *)0x0) {
          local_b0.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_b0.super_PromiseBase.node.disposer._4_4_,
                               local_b0.super_PromiseBase.node.disposer._0_4_))
                    ((undefined8 *)
                     CONCAT44(local_b0.super_PromiseBase.node.disposer._4_4_,
                              local_b0.super_PromiseBase.node.disposer._0_4_),
                     pPVar7->_vptr_PromiseNode[-2] + (long)&pPVar7->_vptr_PromiseNode);
        }
        pMVar9 = local_58;
        if (local_58 != (MembraneHook *)0x0) {
          local_58 = (MembraneHook *)0x0;
          (**(local_60->super_Disposer)._vptr_Disposer)
                    (local_60,(pMVar9->super_ClientHook)._vptr_ClientHook[-2] +
                              (long)&(pMVar9->super_ClientHook)._vptr_ClientHook);
        }
      }
      pPVar7 = pPStack_c0;
      if ((local_d0[0] == '\x01') && (pPStack_c0 != (PromiseNode *)0x0)) {
        pPStack_c0 = (PromiseNode *)0x0;
        (***(_func_int ***)local_d0._8_8_)
                  (local_d0._8_8_,pPVar7->_vptr_PromiseNode[-2] + (long)&pPVar7->_vptr_PromiseNode);
      }
      plVar8 = local_68;
      puVar5 = local_70;
      if ((capnp)bVar2 == (capnp)0x0) {
        local_68 = (long *)0x0;
        (**(code **)(*plVar8 + 8))(__return_storage_ptr__,plVar8,local_88,methodId,context);
        (**(code **)*puVar5)(puVar5,(long)plVar8 + *(long *)(*plVar8 + -0x10));
        __return_storage_ptr__ = local_80;
      }
    }
    else {
      pCVar3 = (this->inner).ptr;
      (*((this->policy).ptr)->_vptr_MembranePolicy[2])(&local_b0);
      bVar2 = this->reverse;
      local_e8.ptr.field_1.value.super_PromiseBase.node.disposer = (Disposer *)operator_new(0xd0);
      pPVar7 = local_b0.super_PromiseBase.node.ptr;
      bVar12 = bVar2 ^ 1;
      local_e8.ptr._0_8_ = (long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 8;
      *(undefined4 *)
       &((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x10))->
        _vptr_Disposer = 0;
      (local_e8.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer =
           (_func_int **)&PTR_getParams_006438b8;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 8))->
      _vptr_Disposer = (_func_int **)&PTR_disposeImpl_00643918;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x18))->
      _vptr_Disposer = (_func_int **)context->disposer;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x20))->
      _vptr_Disposer = (_func_int **)context->ptr;
      context->ptr = (CallContextHook *)0x0;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x28))->
      _vptr_Disposer =
           (_func_int **)
           CONCAT44(local_b0.super_PromiseBase.node.disposer._4_4_,
                    local_b0.super_PromiseBase.node.disposer._0_4_);
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x30))->
      _vptr_Disposer = (_func_int **)local_b0.super_PromiseBase.node.ptr;
      local_b0.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      *(byte *)&((Disposer *)
                ((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x38))->
                _vptr_Disposer = bVar12;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x40))->
      _vptr_Disposer = (_func_int **)&PTR_extractCap_00643480;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x48))->
      _vptr_Disposer = (_func_int **)0x0;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x50))->
      _vptr_Disposer = (_func_int **)pPVar7;
      *(byte *)&((Disposer *)
                ((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x58))->
                _vptr_Disposer = bVar12;
      *(undefined1 *)
       &((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x60))->
        _vptr_Disposer = 0;
      *(undefined1 *)
       &((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x88))->
        _vptr_Disposer = 0;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x90))->
      _vptr_Disposer = (_func_int **)&PTR_extractCap_00643628;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x98))->
      _vptr_Disposer = (_func_int **)0x0;
      ((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0xa0))->
      _vptr_Disposer = (_func_int **)pPVar7;
      *(byte *)&((Disposer *)
                ((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0xa8))->
                _vptr_Disposer = bVar12;
      *(undefined1 *)
       &((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0xb0))->
        _vptr_Disposer = 0;
      *(undefined4 *)
       &((Disposer *)((long)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer + 0x10))->
        _vptr_Disposer = 1;
      (*pCVar3->_vptr_ClientHook[1])(local_d0,pCVar3,uVar13,methodId);
      uVar6 = local_e8.ptr.field_1.value.super_PromiseBase.node.disposer;
      if (local_e8.ptr.field_1.value.super_PromiseBase.node.disposer != (Disposer *)0x0) {
        local_e8.ptr.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
        (***(_func_int ***)local_e8.ptr._0_8_)
                  (local_e8.ptr._0_8_,
                   ((Disposer *)uVar6)->_vptr_Disposer[-2] +
                   (long)&((Disposer *)uVar6)->_vptr_Disposer);
      }
      pPVar7 = local_b0.super_PromiseBase.node.ptr;
      if ((Disposer *)local_b0.super_PromiseBase.node.ptr != (Disposer *)0x0) {
        local_b0.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT44(local_b0.super_PromiseBase.node.disposer._4_4_,
                             local_b0.super_PromiseBase.node.disposer._0_4_))
                  ((undefined8 *)
                   CONCAT44(local_b0.super_PromiseBase.node.disposer._4_4_,
                            local_b0.super_PromiseBase.node.disposer._0_4_),
                   pPVar7->_vptr_PromiseNode[-2] + (long)&pPVar7->_vptr_PromiseNode);
      }
      (*((this->policy).ptr)->_vptr_MembranePolicy[3])(&local_b0);
      __return_storage_ptr__ = local_80;
      local_e8.ptr.isSet = (bool)local_b0.super_PromiseBase.node.disposer._0_1_;
      if (local_b0.super_PromiseBase.node.disposer._0_1_ == (Promise<kj::Own<capnp::ClientHook>>)0x1
         ) {
        local_e8.ptr.field_1.value.super_PromiseBase.node.disposer =
             (Disposer *)local_b0.super_PromiseBase.node.ptr;
        local_e8.ptr.field_1.value.super_PromiseBase.node.ptr = pPStack_a0;
        pPStack_a0 = (PromiseNode *)0x0;
        OVar14 = kj::
                 heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                           ((kj *)&local_b0,(Own<kj::_::PromiseNode> *)local_d0,
                            (Own<kj::_::PromiseNode> *)&local_e8.ptr.field_1.value);
        uVar6 = local_d0._8_8_;
        puVar5 = (undefined8 *)CONCAT44(local_d0._4_4_,local_d0._0_4_);
        local_d0._0_4_ = local_b0.super_PromiseBase.node.disposer._0_4_;
        local_d0._4_4_ = local_b0.super_PromiseBase.node.disposer._4_4_;
        local_d0._8_8_ = local_b0.super_PromiseBase.node.ptr;
        if ((Disposer *)uVar6 != (Disposer *)0x0) {
          (**(code **)*puVar5)
                    (puVar5,(*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6,OVar14.ptr);
        }
      }
      uVar6 = local_e8.ptr.field_1.value.super_PromiseBase.node.ptr;
      if (((capnp)local_e8.ptr.isSet == (capnp)0x1) &&
         (local_e8.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
        local_e8.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (**(local_e8.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                  (local_e8.ptr.field_1.value.super_PromiseBase.node.disposer,
                   ((PromiseNode *)uVar6)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)uVar6)->_vptr_PromiseNode);
      }
      (__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
           (Disposer *)CONCAT44(local_d0._4_4_,local_d0._0_4_);
      (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = (PromiseNode *)local_d0._8_8_;
      local_d0._8_8_ = (Disposer *)0x0;
      (*((this->policy).ptr)->_vptr_MembranePolicy[2])(&local_e8);
      pPVar11 = (PipelineHook *)operator_new(0x40);
      uVar6 = local_d0._8_8_;
      bVar2 = this->reverse;
      *(undefined4 *)&pPVar11[2]._vptr_PipelineHook = 0;
      pPVar11->_vptr_PipelineHook = (_func_int **)&PTR_addRef_00643668;
      pPVar11[1]._vptr_PipelineHook = (_func_int **)&PTR_disposeImpl_006436a0;
      pPVar11[3]._vptr_PipelineHook = (_func_int **)pPStack_c0;
      pPVar11[4]._vptr_PipelineHook = local_b8;
      pPVar11[5]._vptr_PipelineHook = (_func_int **)local_e8.ptr._0_8_;
      pPVar11[6]._vptr_PipelineHook =
           (_func_int **)local_e8.ptr.field_1.value.super_PromiseBase.node.disposer;
      *(bool *)&pPVar11[7]._vptr_PipelineHook = bVar2;
      *(undefined4 *)&pPVar11[2]._vptr_PipelineHook = 1;
      (__return_storage_ptr__->pipeline).disposer = (Disposer *)(pPVar11 + 1);
      (__return_storage_ptr__->pipeline).ptr = pPVar11;
      local_b8 = (_func_int **)0x0;
      local_e8.ptr.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
      if ((Disposer *)local_d0._8_8_ != (Disposer *)0x0) {
        local_d0._8_8_ = (Disposer *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_d0._4_4_,local_d0._0_4_))
                  ((undefined8 *)CONCAT44(local_d0._4_4_,local_d0._0_4_),
                   (*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6);
      }
    }
    plVar8 = local_68;
    if ((local_78[0] == '\x01') && (local_68 != (long *)0x0)) {
      local_68 = (long *)0x0;
      (**(code **)*local_70)(local_70,(long)plVar8 + *(long *)(*plVar8 + -0x10));
    }
  }
  else {
    pCVar3 = (this->resolved).ptr.ptr;
    (*pCVar3->_vptr_ClientHook[1])(__return_storage_ptr__,pCVar3,interfaceId,methodId,context);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_MAYBE(r, resolved) {
      return r->get()->call(interfaceId, methodId, kj::mv(context));
    }